

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingManager.cpp
# Opt level: O3

AbstractLoggingDevice * __thiscall
SLogLib::LoggingManager::QueryDevice(LoggingManager *this,string *deviceName)

{
  byte bVar1;
  LoggingManagerPriv *pLVar2;
  size_t __n;
  _Alloc_hider _Var3;
  uint uVar4;
  int iVar5;
  AbstractLoggingDevice *pAVar6;
  vector<SLogLib::CallInfo,std::allocator<SLogLib::CallInfo>> *this_00;
  AbstractLoggingDevice *extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  LoggingManagerPriv *pLVar7;
  string *__args;
  mutex *__mutex;
  long *plVar8;
  bool bVar9;
  uint uStack_6c;
  string local_50;
  
  __mutex = &this->mPriv->mLoggingDevicesMutex;
  __args = deviceName;
  uVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (uVar4 != 0) {
    plVar8 = (long *)(ulong)uVar4;
    std::__throw_system_error(uVar4);
    bVar1 = *(byte *)(*plVar8 + 0x40);
    pAVar6 = (AbstractLoggingDevice *)CONCAT71((int7)((ulong)*plVar8 >> 8),bVar1);
    if ((bVar1 & 1) == 0) {
      gCallStack::__tls_init();
      this_00 = (vector<SLogLib::CallInfo,std::allocator<SLogLib::CallInfo>> *)
                __tls_get_addr(&PTR_0010afa0);
      std::vector<SLogLib::CallInfo,std::allocator<SLogLib::CallInfo>>::
      emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int&>
                (this_00,__args,__args_1,&uStack_6c);
      pAVar6 = extraout_RAX;
    }
    return pAVar6;
  }
  pLVar2 = this->mPriv;
  for (pLVar7 = (LoggingManagerPriv *)
                (pLVar2->mLoggingDevices).
                super__List_base<SLogLib::AbstractLoggingDevice_*,_std::allocator<SLogLib::AbstractLoggingDevice_*>_>
                ._M_impl._M_node.super__List_node_base._M_next; pLVar7 != pLVar2;
      pLVar7 = (LoggingManagerPriv *)
               (pLVar7->mLoggingDevices).
               super__List_base<SLogLib::AbstractLoggingDevice_*,_std::allocator<SLogLib::AbstractLoggingDevice_*>_>
               ._M_impl._M_node.super__List_node_base._M_next) {
    pAVar6 = (AbstractLoggingDevice *)
             (pLVar7->mLoggingDevices).
             super__List_base<SLogLib::AbstractLoggingDevice_*,_std::allocator<SLogLib::AbstractLoggingDevice_*>_>
             ._M_impl._M_node._M_size;
    if (pAVar6 != (AbstractLoggingDevice *)0x0) {
      AbstractLoggingDevice::Name_abi_cxx11_(&local_50,pAVar6);
      _Var3._M_p = local_50._M_dataplus._M_p;
      __n = deviceName->_M_string_length;
      if (__n == local_50._M_string_length) {
        if (__n == 0) {
          bVar9 = true;
        }
        else {
          iVar5 = bcmp((deviceName->_M_dataplus)._M_p,local_50._M_dataplus._M_p,__n);
          bVar9 = iVar5 == 0;
        }
      }
      else {
        bVar9 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var3._M_p != &local_50.field_2) {
        operator_delete(_Var3._M_p);
      }
      if (bVar9) goto LAB_00105ef0;
    }
  }
  pAVar6 = (AbstractLoggingDevice *)0x0;
LAB_00105ef0:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return pAVar6;
}

Assistant:

AbstractLoggingDevice* LoggingManager::QueryDevice(const std::string& deviceName)
{
	// Lock must be here because another thread can add/remove 
	// a new device while the for loop is running.
	std::lock_guard<std::mutex> _lock(mPriv->mLoggingDevicesMutex);
	
	for(AbstractLoggingDevice* _device : mPriv->mLoggingDevices)
	{
		if(_device && deviceName == _device->Name())
		{
			return _device;
		}
	}
	return nullptr;
}